

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O1

char * duckdb_yyjson::yyjson_read_number
                 (char *dat,yyjson_val *val,yyjson_read_flag flg,yyjson_alc *alc,
                 yyjson_read_err *err)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  uint uVar22;
  ulong uVar23;
  char *pcVar24;
  ulong uVar25;
  ulong extraout_RAX;
  byte bVar26;
  sbyte sVar27;
  byte *pbVar28;
  long lVar29;
  long lVar30;
  u64 uVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  uint64_t uVar35;
  byte *pbVar36;
  ulong uVar37;
  byte *pbVar38;
  int iVar39;
  int iVar40;
  char cVar41;
  ulong uVar42;
  u64 *__s;
  byte *pbVar43;
  byte *pbVar44;
  bool bVar45;
  double dVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  u8 *cur;
  char *msg;
  i32 exp;
  u8 *raw_end;
  bigint big_full;
  byte *local_4a0;
  byte *local_498;
  u8 **local_490;
  char *local_488;
  yyjson_read_flag local_47c;
  byte *local_478;
  yyjson_val *local_470;
  uint local_464;
  bigint *local_460;
  ulong local_458;
  yyjson_read_err *local_450;
  u8 *local_448;
  bigint local_440;
  bigint local_238;
  
  if (dat == (char *)0x0) {
    if (err == (yyjson_read_err *)0x0) {
      return (char *)0x0;
    }
    err->pos = 0;
    pcVar24 = "input data is NULL";
LAB_01d49b1a:
    err->msg = pcVar24;
    err->code = 1;
    return (char *)0x0;
  }
  if (val == (yyjson_val *)0x0) {
    if (err == (yyjson_read_err *)0x0) {
      return (char *)0x0;
    }
    err->pos = 0;
    pcVar24 = "output value is NULL";
    goto LAB_01d49b1a;
  }
  cVar41 = (char)flg;
  bVar45 = (flg & 0xa0) != 0;
  local_448 = (u8 *)0x0;
  local_490 = (u8 **)0x0;
  if (bVar45) {
    local_490 = &local_448;
  }
  local_464 = 0;
  if (-1 < cVar41 && bVar45) {
    local_4a0 = (byte *)dat;
    bVar45 = read_number_raw(&local_4a0,local_490,flg,val,&local_488);
    goto LAB_01d49ac5;
  }
  cVar2 = *dat;
  uVar34 = (ulong)(cVar2 == '-');
  local_4a0 = (byte *)(dat + uVar34);
  bVar26 = dat[uVar34];
  uVar25 = (ulong)bVar26;
  if ((digi_table[uVar25] & 2) == 0) {
    if (bVar26 != 0x30) {
      if ((flg & 0x10) != 0) {
        if ((((bVar26 | 0x20) == 0x69) && ((local_4a0[1] | 0x20) == 0x6e)) &&
           ((local_4a0[2] | 0x20) == 0x66)) {
          pbVar38 = local_4a0 + 3;
          if ((((local_4a0[3] | 0x20) == 0x69) && ((local_4a0[4] | 0x20) == 0x6e)) &&
             (((local_4a0[5] | 0x20) == 0x69 &&
              (((local_4a0[6] | 0x20) == 0x74 && ((local_4a0[7] | 0x20) == 0x79)))))) {
            pbVar38 = local_4a0 + 8;
          }
          if ((flg & 0xa0) == 0) {
            val->tag = 0x14;
            (val->uni).str = (char *)(((ulong)(cVar2 != '-') << 0x3f) + -0x10000000000000);
          }
          else {
            uVar35 = (long)local_4a0 - (ulong)(cVar2 == '-');
            if (*local_490 != (u8 *)0x0) {
              **local_490 = '\0';
            }
            *local_490 = pbVar38;
            val->tag = ((long)pbVar38 - uVar35) * 0x100 + 1;
            (val->uni).u64 = uVar35;
          }
          bVar45 = true;
          local_4a0 = pbVar38;
        }
        else {
          bVar45 = false;
        }
        bVar17 = true;
        if (!bVar45) {
          if ((((*local_4a0 | 0x20) == 0x6e) && ((local_4a0[1] | 0x20) == 0x61)) &&
             ((local_4a0[2] | 0x20) == 0x6e)) {
            if ((flg & 0xa0) == 0) {
              val->tag = 0x14;
              pbVar38 = (byte *)(((ulong)(cVar2 != '-') << 0x3f) + -0x8000000000000);
            }
            else {
              pbVar38 = local_4a0 + -(ulong)(cVar2 == '-');
              if (*local_490 != (u8 *)0x0) {
                **local_490 = '\0';
              }
              *local_490 = local_4a0 + 3;
              val->tag = (ulong)(cVar2 == '-') * 0x100 + 0x301;
            }
            (val->uni).str = (char *)pbVar38;
            local_4a0 = local_4a0 + 3;
          }
          else {
            bVar17 = false;
          }
        }
        if (bVar17) {
          return (char *)local_4a0;
        }
      }
      local_488 = "no digit after minus sign";
      goto LAB_01d4a9ae;
    }
    local_498 = local_4a0 + 1;
    if ((digi_table[local_4a0[1]] & 0x33) == 0) {
      val->tag = (ulong)(cVar2 == '-') * 8 + 4;
      (val->uni).u64 = 0;
      return (char *)local_498;
    }
    if (local_4a0[1] == 0x2e) {
      if ((digi_table[local_4a0[2]] & 3) == 0) {
        pbVar38 = local_4a0 + 2;
LAB_01d4a99d:
        local_488 = "no digit after decimal point";
        local_4a0 = pbVar38;
        goto LAB_01d4a9ae;
      }
      local_498 = (byte *)(dat + uVar34 + 1);
      do {
        pbVar44 = local_498;
        uVar34 = (ulong)pbVar44[1];
        local_498 = pbVar44 + 1;
      } while (uVar34 == 0x30);
      if ((digi_table[uVar34] & 3) != 0) {
        uVar34 = uVar34 - 0x30;
        goto LAB_01d4a4ce;
      }
    }
    if ((digi_table[*local_498] & 3) == 0) {
      if ((digi_table[*local_498] & 0x20) != 0) {
        local_4a0 = (byte *)dat;
        yyjson_read_number();
        if ((extraout_RAX & 1) != 0) goto LAB_01d4a9ae;
        local_498 = (byte *)CONCAT44(local_440._4_4_,local_440.used);
      }
      val->tag = 0x14;
      (val->uni).u64 = (ulong)(cVar2 == '-') << 0x3f;
      return (char *)local_498;
    }
    local_488 = "number with leading zero is not allowed";
    local_4a0 = local_498 + -1;
    goto LAB_01d4a9ae;
  }
  uVar34 = uVar25 - 0x30;
  bVar26 = local_4a0[1];
  uVar23 = (ulong)bVar26 - 0x30;
  if (uVar23 < 10) {
    uVar34 = uVar23 + uVar34 * 10;
    bVar26 = local_4a0[2];
    uVar25 = (ulong)bVar26 - 0x30;
    if (uVar25 < 10) {
      uVar34 = uVar25 + uVar34 * 10;
      bVar26 = local_4a0[3];
      uVar25 = (ulong)bVar26 - 0x30;
      if (uVar25 < 10) {
        uVar34 = uVar25 + uVar34 * 10;
        bVar26 = local_4a0[4];
        uVar25 = (ulong)bVar26 - 0x30;
        if (uVar25 < 10) {
          uVar34 = uVar25 + uVar34 * 10;
          bVar26 = local_4a0[5];
          uVar25 = (ulong)bVar26 - 0x30;
          if (uVar25 < 10) {
            uVar34 = uVar25 + uVar34 * 10;
            bVar26 = local_4a0[6];
            uVar25 = (ulong)bVar26 - 0x30;
            if (uVar25 < 10) {
              uVar34 = uVar25 + uVar34 * 10;
              bVar26 = local_4a0[7];
              uVar25 = (ulong)bVar26 - 0x30;
              if (uVar25 < 10) {
                uVar34 = uVar25 + uVar34 * 10;
                bVar26 = local_4a0[8];
                uVar25 = (ulong)bVar26 - 0x30;
                if (uVar25 < 10) {
                  uVar34 = uVar25 + uVar34 * 10;
                  bVar26 = local_4a0[9];
                  uVar25 = (ulong)bVar26 - 0x30;
                  if (uVar25 < 10) {
                    uVar34 = uVar25 + uVar34 * 10;
                    bVar26 = local_4a0[10];
                    uVar25 = (ulong)bVar26 - 0x30;
                    if (uVar25 < 10) {
                      uVar34 = uVar25 + uVar34 * 10;
                      bVar26 = local_4a0[0xb];
                      uVar25 = (ulong)bVar26 - 0x30;
                      if (uVar25 < 10) {
                        uVar34 = uVar25 + uVar34 * 10;
                        bVar26 = local_4a0[0xc];
                        uVar25 = (ulong)bVar26 - 0x30;
                        if (uVar25 < 10) {
                          uVar34 = uVar25 + uVar34 * 10;
                          bVar26 = local_4a0[0xd];
                          uVar25 = (ulong)bVar26 - 0x30;
                          if (uVar25 < 10) {
                            uVar34 = uVar25 + uVar34 * 10;
                            bVar26 = local_4a0[0xe];
                            uVar25 = (ulong)bVar26 - 0x30;
                            if (uVar25 < 10) {
                              uVar34 = uVar25 + uVar34 * 10;
                              bVar26 = local_4a0[0xf];
                              uVar25 = (ulong)bVar26 - 0x30;
                              if (uVar25 < 10) {
                                uVar34 = uVar25 + uVar34 * 10;
                                bVar26 = local_4a0[0x10];
                                uVar25 = (ulong)bVar26 - 0x30;
                                if (uVar25 < 10) {
                                  uVar34 = uVar25 + uVar34 * 10;
                                  bVar26 = local_4a0[0x11];
                                  uVar25 = (ulong)bVar26 - 0x30;
                                  if (uVar25 < 10) {
                                    uVar34 = uVar25 + uVar34 * 10;
                                    bVar26 = local_4a0[0x12];
                                    uVar25 = (ulong)bVar26 - 0x30;
                                    if (uVar25 < 10) {
                                      uVar34 = uVar25 + uVar34 * 10;
                                      pbVar38 = local_4a0 + 0x13;
                                      bVar26 = local_4a0[0x13];
                                      bVar3 = digi_table[bVar26];
                                      if ((bVar3 & 0x33) != 0) {
                                        if (((bVar3 & 3) != 0) &&
                                           ((digi_table[local_4a0[0x14]] & 0x33) == 0)) {
                                          uVar25 = (ulong)bVar26 - 0x30;
                                          if ((uVar34 < 0x1999999999999999) ||
                                             ((uVar34 == 0x1999999999999999 && (uVar25 < 6)))) {
                                            local_4a0 = local_4a0 + 0x14;
                                            uVar35 = uVar25 + uVar34 * 10;
                                            if (cVar2 != '-') {
                                              val->tag = 4;
                                              (val->uni).u64 = uVar35;
                                              return (char *)local_4a0;
                                            }
                                            if (cVar41 < '\0') {
                                              if (*local_490 != (u8 *)0x0) {
                                                **local_490 = '\0';
                                              }
                                              val->tag = ((long)local_4a0 - (long)dat) * 0x100 + 1;
                                              (val->uni).str = dat;
                                              *local_490 = local_4a0;
                                              return (char *)local_4a0;
                                            }
                                            auVar48._8_4_ = (int)(uVar35 >> 0x20);
                                            auVar48._0_8_ = uVar35;
                                            auVar48._12_4_ = 0x45300000;
                                            val->tag = 0x14;
                                            (val->uni).f64 =
                                                 -((auVar48._8_8_ - 1.9342813113834067e+25) +
                                                  ((double)CONCAT44(0x43300000,(int)uVar35) -
                                                  4503599627370496.0));
                                            return (char *)local_4a0;
                                          }
                                        }
                                        local_498 = pbVar38;
                                        if ((bVar3 & 0x20) != 0) {
                                          pbVar38 = (byte *)0x0;
                                          goto LAB_01d4959a;
                                        }
                                        if (bVar26 == 0x2e) {
                                          pbVar38 = local_4a0 + 0x14;
                                          if ((digi_table[local_4a0[0x14]] & 3) == 0)
                                          goto LAB_01d4a99d;
                                        }
                                        else {
                                          local_498 = (byte *)0x0;
                                        }
LAB_01d4962d:
                                        uVar35 = (long)pbVar38 * 0x100 + (long)dat * -0x100 + 1;
                                        local_4a0 = pbVar38 + 1;
                                        do {
                                          pbVar44 = local_4a0;
                                          local_4a0 = pbVar44 + 1;
                                          uVar35 = uVar35 + 0x100;
                                        } while ((digi_table[*pbVar44] & 3) != 0);
                                        if (local_498 == (byte *)0x0) {
                                          if ((cVar41 < '\0') &&
                                             ((digi_table[*pbVar44] & 0x30) == 0)) {
                                            if (*local_490 != (u8 *)0x0) {
                                              **local_490 = '\0';
                                            }
                                            val->tag = uVar35;
                                            (val->uni).str = dat;
                                            *local_490 = pbVar44;
                                            return (char *)pbVar44;
                                          }
                                          local_498 = pbVar44;
                                          if (*pbVar44 == 0x2e) {
                                            if ((digi_table[*local_4a0] & 3) == 0) {
                                              local_488 = "no digit after decimal point";
                                              goto LAB_01d4a9ae;
                                            }
                                            do {
                                              pbVar28 = pbVar44 + 1;
                                              pbVar44 = pbVar44 + 1;
                                            } while ((digi_table[*pbVar28] & 3) != 0);
                                          }
                                        }
                                        uVar34 = uVar34 + (0x34 < *pbVar38);
                                        pbVar28 = pbVar44;
                                        do {
                                          do {
                                            pbVar28 = pbVar28 + -1;
                                          } while (*pbVar28 == 0x30);
                                        } while (*pbVar28 == 0x2e);
                                        pbVar36 = local_498 +
                                                  ((ulong)(local_498 < pbVar38) - (long)pbVar38);
                                        bVar45 = pbVar28 < pbVar38;
                                        pbVar28 = pbVar38;
                                        pbVar38 = pbVar44;
                                        if (bVar45) {
                                          pbVar28 = (byte *)0x0;
                                          pbVar38 = (byte *)0x0;
                                        }
                                        if ((digi_table[*pbVar44] & 0x20) != 0) goto LAB_01d49714;
                                        goto LAB_01d49796;
                                      }
                                      if ((cVar2 == '-') && (0x8000000000000000 < uVar34)) {
                                        if (cVar41 < '\0') {
                                          if (*local_490 != (u8 *)0x0) {
                                            **local_490 = '\0';
                                          }
                                          val->tag = ((long)pbVar38 - (long)dat) * 0x100 + 1;
                                          (val->uni).str = dat;
                                          *local_490 = pbVar38;
                                          return (char *)pbVar38;
                                        }
                                        auVar47._8_4_ = (int)(uVar34 >> 0x20);
                                        auVar47._0_8_ = uVar34;
                                        auVar47._12_4_ = 0x45300000;
                                        val->tag = 0x14;
                                        (val->uni).f64 =
                                             -((auVar47._8_8_ - 1.9342813113834067e+25) +
                                              ((double)CONCAT44(0x43300000,(int)uVar34) -
                                              4503599627370496.0));
                                        return (char *)pbVar38;
                                      }
                                    }
                                    else {
                                      pbVar38 = local_4a0 + 0x12;
                                      if ((digi_table[bVar26] & 0x30) != 0) {
                                        local_498 = pbVar38;
                                        if (bVar26 == 0x2e) goto LAB_01d4a699;
                                        goto LAB_01d4959a;
                                      }
                                    }
                                  }
                                  else {
                                    pbVar38 = local_4a0 + 0x11;
                                    if ((digi_table[bVar26] & 0x30) != 0) {
                                      local_498 = pbVar38;
                                      if (bVar26 != 0x2e) goto LAB_01d4959a;
                                      goto LAB_01d4a67e;
                                    }
                                  }
                                }
                                else {
                                  pbVar38 = local_4a0 + 0x10;
                                  if ((digi_table[bVar26] & 0x30) != 0) {
                                    local_498 = pbVar38;
                                    if (bVar26 != 0x2e) goto LAB_01d4959a;
                                    goto LAB_01d4a663;
                                  }
                                }
                              }
                              else {
                                pbVar38 = local_4a0 + 0xf;
                                if ((digi_table[bVar26] & 0x30) != 0) {
                                  local_498 = pbVar38;
                                  if (bVar26 != 0x2e) goto LAB_01d4959a;
                                  goto LAB_01d4a648;
                                }
                              }
                            }
                            else {
                              pbVar38 = local_4a0 + 0xe;
                              if ((digi_table[bVar26] & 0x30) != 0) {
                                local_498 = pbVar38;
                                if (bVar26 != 0x2e) goto LAB_01d4959a;
                                goto LAB_01d4a62d;
                              }
                            }
                          }
                          else {
                            pbVar38 = local_4a0 + 0xd;
                            if ((digi_table[bVar26] & 0x30) != 0) {
                              local_498 = pbVar38;
                              if (bVar26 != 0x2e) goto LAB_01d4959a;
                              goto LAB_01d4a612;
                            }
                          }
                        }
                        else {
                          pbVar38 = local_4a0 + 0xc;
                          if ((digi_table[bVar26] & 0x30) != 0) {
                            local_498 = pbVar38;
                            if (bVar26 != 0x2e) goto LAB_01d4959a;
                            goto LAB_01d4a5f7;
                          }
                        }
                      }
                      else {
                        pbVar38 = local_4a0 + 0xb;
                        if ((digi_table[bVar26] & 0x30) != 0) {
                          local_498 = pbVar38;
                          if (bVar26 != 0x2e) goto LAB_01d4959a;
                          goto LAB_01d4a5dc;
                        }
                      }
                    }
                    else {
                      pbVar38 = local_4a0 + 10;
                      if ((digi_table[bVar26] & 0x30) != 0) {
                        local_498 = pbVar38;
                        if (bVar26 != 0x2e) goto LAB_01d4959a;
                        goto LAB_01d4a5c1;
                      }
                    }
                  }
                  else {
                    pbVar38 = local_4a0 + 9;
                    if ((digi_table[bVar26] & 0x30) != 0) {
                      local_498 = pbVar38;
                      if (bVar26 != 0x2e) goto LAB_01d4959a;
                      goto LAB_01d4a5a6;
                    }
                  }
                }
                else {
                  pbVar38 = local_4a0 + 8;
                  if ((digi_table[bVar26] & 0x30) != 0) {
                    local_498 = pbVar38;
                    if (bVar26 != 0x2e) goto LAB_01d4959a;
                    goto LAB_01d4a58b;
                  }
                }
              }
              else {
                pbVar38 = local_4a0 + 7;
                if ((digi_table[bVar26] & 0x30) != 0) {
                  local_498 = pbVar38;
                  if (bVar26 != 0x2e) goto LAB_01d4959a;
                  goto LAB_01d4a570;
                }
              }
            }
            else {
              pbVar38 = local_4a0 + 6;
              if ((digi_table[bVar26] & 0x30) != 0) {
                local_498 = pbVar38;
                if (bVar26 != 0x2e) goto LAB_01d4959a;
                goto LAB_01d4a555;
              }
            }
          }
          else {
            pbVar38 = local_4a0 + 5;
            if ((digi_table[bVar26] & 0x30) != 0) {
              local_498 = pbVar38;
              if (bVar26 != 0x2e) goto LAB_01d4959a;
              goto LAB_01d4a53a;
            }
          }
        }
        else {
          pbVar38 = local_4a0 + 4;
          if ((digi_table[bVar26] & 0x30) != 0) {
            local_498 = pbVar38;
            if (bVar26 != 0x2e) goto LAB_01d4959a;
            goto LAB_01d4a51f;
          }
        }
      }
      else {
        pbVar38 = local_4a0 + 3;
        if ((digi_table[bVar26] & 0x30) != 0) {
          local_498 = pbVar38;
          if (bVar26 != 0x2e) goto LAB_01d4959a;
          goto LAB_01d4a504;
        }
      }
    }
    else {
      pbVar38 = local_4a0 + 2;
      if ((digi_table[bVar26] & 0x30) != 0) {
        local_498 = pbVar38;
        if (bVar26 == 0x2e) goto LAB_01d4a4e9;
        goto LAB_01d4959a;
      }
    }
    val->tag = (ulong)(cVar2 == '-') * 8 + 4;
    uVar25 = -uVar34;
    if (cVar2 != '-') {
      uVar25 = uVar34;
    }
    goto LAB_01d49e31;
  }
  pbVar38 = local_4a0 + 1;
  if ((digi_table[bVar26] & 0x30) == 0) {
    val->tag = (ulong)(cVar2 == '-') * 8 + 4;
    if (cVar2 == '-') {
      uVar34 = 0x30 - uVar25;
    }
    (val->uni).u64 = uVar34;
    return (char *)pbVar38;
  }
  pbVar44 = local_4a0;
  local_498 = pbVar38;
  if (bVar26 != 0x2e) {
LAB_01d4959a:
    pbVar36 = (byte *)0x0;
    pbVar28 = (byte *)0x0;
    pbVar44 = local_498;
LAB_01d49714:
    bVar26 = pbVar44[1];
    uVar25 = (ulong)((digi_table[bVar26] & 0xc) != 0);
    if ((digi_table[pbVar44[uVar25 + 1]] & 3) == 0) {
      local_4a0 = pbVar44 + uVar25 + 1;
      local_488 = "no digit after exponent sign";
      goto LAB_01d4a9ae;
    }
    pbVar43 = pbVar44 + uVar25;
    pbVar44 = pbVar43;
    do {
      pbVar43 = pbVar43 + 1;
      pbVar1 = pbVar44 + 1;
      pbVar44 = pbVar44 + 1;
    } while (*pbVar1 == 0x30);
    uVar25 = (ulong)*pbVar44;
    if ((digi_table[uVar25] & 3) == 0) {
      lVar29 = 0;
    }
    else {
      lVar29 = 0;
      do {
        lVar29 = (ulong)(byte)((char)uVar25 - 0x30) + lVar29 * 10;
        uVar25 = (ulong)pbVar44[1];
        pbVar44 = pbVar44 + 1;
      } while ((digi_table[uVar25] & 3) != 0);
    }
    if ((long)pbVar44 - (long)pbVar43 < 0x13) {
      lVar30 = -lVar29;
      if (bVar26 != 0x2d) {
        lVar30 = lVar29;
      }
      pbVar36 = pbVar36 + lVar30;
LAB_01d49796:
      if (-0x158 < (long)pbVar36) {
        if ((long)pbVar36 < 0x135) goto LAB_01d497b0;
LAB_01d49ea8:
        if (cVar41 < '\0') {
          if (*local_490 != (u8 *)0x0) {
            **local_490 = '\0';
          }
          val->tag = ((long)pbVar44 - (long)dat) * 0x100 + 1;
          (val->uni).str = dat;
          *local_490 = pbVar44;
          return (char *)pbVar44;
        }
        if ((flg & 0x10) != 0) {
          val->tag = 0x14;
          (val->uni).str = (char *)(((ulong)(cVar2 != '-') << 0x3f) + -0x10000000000000);
          return (char *)pbVar44;
        }
        local_488 = "number is infinity when parsed as double";
        local_4a0 = (byte *)dat;
        goto LAB_01d4a9ae;
      }
    }
    else if (bVar26 != 0x2d) goto LAB_01d49ea8;
LAB_01d49e91:
    val->tag = 0x14;
    uVar25 = (ulong)(cVar2 == '-') << 0x3f;
    pbVar38 = pbVar44;
LAB_01d49e31:
    (val->uni).u64 = uVar25;
    return (char *)pbVar38;
  }
LAB_01d4a4ce:
  local_498 = local_4a0 + 1;
  if ((ulong)pbVar44[2] - 0x30 < 10) {
    uVar34 = ((ulong)pbVar44[2] - 0x30) + uVar34 * 10;
    local_4a0 = pbVar44;
LAB_01d4a4e9:
    if ((ulong)local_4a0[3] - 0x30 < 10) {
      uVar34 = ((ulong)local_4a0[3] - 0x30) + uVar34 * 10;
LAB_01d4a504:
      if ((ulong)local_4a0[4] - 0x30 < 10) {
        uVar34 = ((ulong)local_4a0[4] - 0x30) + uVar34 * 10;
LAB_01d4a51f:
        if ((ulong)local_4a0[5] - 0x30 < 10) {
          uVar34 = ((ulong)local_4a0[5] - 0x30) + uVar34 * 10;
LAB_01d4a53a:
          if ((ulong)local_4a0[6] - 0x30 < 10) {
            uVar34 = ((ulong)local_4a0[6] - 0x30) + uVar34 * 10;
LAB_01d4a555:
            if ((ulong)local_4a0[7] - 0x30 < 10) {
              uVar34 = ((ulong)local_4a0[7] - 0x30) + uVar34 * 10;
LAB_01d4a570:
              if ((ulong)local_4a0[8] - 0x30 < 10) {
                uVar34 = ((ulong)local_4a0[8] - 0x30) + uVar34 * 10;
LAB_01d4a58b:
                if ((ulong)local_4a0[9] - 0x30 < 10) {
                  uVar34 = ((ulong)local_4a0[9] - 0x30) + uVar34 * 10;
LAB_01d4a5a6:
                  if ((ulong)local_4a0[10] - 0x30 < 10) {
                    uVar34 = ((ulong)local_4a0[10] - 0x30) + uVar34 * 10;
LAB_01d4a5c1:
                    if ((ulong)local_4a0[0xb] - 0x30 < 10) {
                      uVar34 = ((ulong)local_4a0[0xb] - 0x30) + uVar34 * 10;
LAB_01d4a5dc:
                      if ((ulong)local_4a0[0xc] - 0x30 < 10) {
                        uVar34 = ((ulong)local_4a0[0xc] - 0x30) + uVar34 * 10;
LAB_01d4a5f7:
                        if ((ulong)local_4a0[0xd] - 0x30 < 10) {
                          uVar34 = ((ulong)local_4a0[0xd] - 0x30) + uVar34 * 10;
LAB_01d4a612:
                          if ((ulong)local_4a0[0xe] - 0x30 < 10) {
                            uVar34 = ((ulong)local_4a0[0xe] - 0x30) + uVar34 * 10;
LAB_01d4a62d:
                            if ((ulong)local_4a0[0xf] - 0x30 < 10) {
                              uVar34 = ((ulong)local_4a0[0xf] - 0x30) + uVar34 * 10;
LAB_01d4a648:
                              if ((ulong)local_4a0[0x10] - 0x30 < 10) {
                                uVar34 = ((ulong)local_4a0[0x10] - 0x30) + uVar34 * 10;
LAB_01d4a663:
                                if ((ulong)local_4a0[0x11] - 0x30 < 10) {
                                  uVar34 = ((ulong)local_4a0[0x11] - 0x30) + uVar34 * 10;
LAB_01d4a67e:
                                  if ((ulong)local_4a0[0x12] - 0x30 < 10) {
                                    uVar34 = ((ulong)local_4a0[0x12] - 0x30) + uVar34 * 10;
LAB_01d4a699:
                                    if ((ulong)local_4a0[0x13] - 0x30 < 10) {
                                      uVar34 = ((ulong)local_4a0[0x13] - 0x30) + uVar34 * 10;
                                      pbVar38 = local_4a0 + 0x14;
                                      if ((digi_table[local_4a0[0x14]] & 3) != 0) goto LAB_01d4962d;
                                    }
                                    else {
                                      pbVar38 = local_4a0 + 0x13;
                                    }
                                  }
                                  else {
                                    pbVar38 = local_4a0 + 0x12;
                                  }
                                }
                                else {
                                  pbVar38 = local_4a0 + 0x11;
                                }
                              }
                              else {
                                pbVar38 = local_4a0 + 0x10;
                              }
                            }
                            else {
                              pbVar38 = local_4a0 + 0xf;
                            }
                          }
                          else {
                            pbVar38 = local_4a0 + 0xe;
                          }
                        }
                        else {
                          pbVar38 = local_4a0 + 0xd;
                        }
                      }
                      else {
                        pbVar38 = local_4a0 + 0xc;
                      }
                    }
                    else {
                      pbVar38 = local_4a0 + 0xb;
                    }
                  }
                  else {
                    pbVar38 = local_4a0 + 10;
                  }
                }
                else {
                  pbVar38 = local_4a0 + 9;
                }
              }
              else {
                pbVar38 = local_4a0 + 8;
              }
            }
            else {
              pbVar38 = local_4a0 + 7;
            }
          }
          else {
            pbVar38 = local_4a0 + 6;
          }
        }
        else {
          pbVar38 = local_4a0 + 5;
        }
      }
      else {
        pbVar38 = local_4a0 + 4;
      }
    }
    else {
      pbVar38 = local_4a0 + 3;
    }
  }
  else {
    pbVar38 = pbVar44 + 2;
  }
  if (local_498 + 1 == pbVar38) {
    local_488 = "no digit after decimal point";
    local_4a0 = pbVar38;
    goto LAB_01d4a9ae;
  }
  pbVar36 = local_498 + (1 - (long)pbVar38);
  pbVar44 = pbVar38;
  if ((digi_table[*pbVar38] & 0x20) != 0) {
    pbVar28 = (byte *)0x0;
    goto LAB_01d49714;
  }
  if ((long)pbVar36 < -0x157) goto LAB_01d49e91;
  pbVar28 = (byte *)0x0;
LAB_01d497b0:
  local_464 = (uint)pbVar36;
  if ((uVar34 >> 0x35 == 0) && (local_464 + 0x16 < 0x2d)) {
    if ((int)local_464 < 0) {
      dVar46 = (double)(long)uVar34 / *(double *)(f64_pow10_table + (ulong)-local_464 * 8);
    }
    else {
      dVar46 = (double)(long)uVar34 *
               *(double *)(f64_pow10_table + (ulong)(local_464 & 0x7fffffff) * 8);
    }
    val->tag = 0x14;
    if (cVar2 == '-') {
      dVar46 = -dVar46;
    }
    (val->uni).f64 = dVar46;
    return (char *)pbVar44;
  }
  if ((local_464 + 0x132 < 0x252) && (pbVar28 == (byte *)0x0)) {
    uVar25 = 0x3f;
    if (uVar34 != 0) {
      for (; uVar34 >> uVar25 == 0; uVar25 = uVar25 - 1) {
      }
    }
    uVar42 = uVar34 << ((byte)(uVar25 ^ 0x3f) & 0x3f);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar42;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = *(ulong *)(pow10_sig_table + (long)(int)(local_464 * 2 + 0x2ae) * 8);
    auVar5 = auVar5 * auVar10;
    lVar29 = auVar5._8_8_;
    uVar23 = auVar5._0_8_;
    bVar45 = true;
    if (0x1fd < (ulong)(auVar5._8_4_ & 0x1ff) - 1) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar42;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = *(ulong *)(pow10_sig_table + (long)(int)(local_464 * 2 + 0x2af) * 8);
      lVar30 = SUB168(auVar6 * auVar11,8);
      if ((lVar30 + uVar23) - 1 < 0xfffffffffffffffe) {
        lVar29 = lVar29 + (ulong)(lVar30 + uVar23 < uVar23);
      }
      else {
        bVar45 = false;
      }
    }
    if (bVar45) {
      uVar34 = lVar29 << (-1 < lVar29);
      uVar34 = (uVar34 & 0x400) + uVar34;
      val->tag = 0x14;
      uVar25 = (ulong)(cVar2 == '-') << 0x3f |
               uVar34 >> 0xb & 0xfffffffffffff |
               (ulong)(((((int)(local_464 * 0x3526a + -0x3f0000) >> 0x10) - (int)(uVar25 ^ 0x3f)) -
                       (uint)(-1 < lVar29)) + 0x47e + (uint)(uVar34 < 0x400)) << 0x34;
      pbVar38 = pbVar44;
      goto LAB_01d49e31;
    }
  }
  uVar25 = 0x3f;
  if (uVar34 != 0) {
    for (; uVar34 >> uVar25 == 0; uVar25 = uVar25 - 1) {
    }
  }
  bVar26 = (byte)(uVar25 ^ 0x3f);
  lVar29 = ((ulong)(pbVar28 != (byte *)0x0) << 2) << (bVar26 & 0x3f);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(long *)(pow10_sig_table + (long)(int)(local_464 * 2 + 0x2ae) * 8) -
                 (*(long *)(pow10_sig_table + (long)(int)(local_464 * 2 + 0x2af) * 8) >> 0x3f);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar34 << (bVar26 & 0x3f);
  uVar42 = SUB168(auVar7 * auVar12,8) - (SUB168(auVar7 * auVar12,0) >> 0x3f);
  uVar23 = 0x3f;
  if (uVar42 != 0) {
    for (; uVar42 >> uVar23 == 0; uVar23 = uVar23 - 1) {
    }
  }
  bVar26 = (byte)(uVar23 ^ 0x3f);
  uVar42 = uVar42 << (bVar26 & 0x3f);
  uVar37 = (9 - (ulong)(lVar29 == 0)) + lVar29 << (bVar26 & 0x3f);
  iVar39 = (((int)(local_464 * 0x3526a + -0x3f0000) >> 0x10) -
           ((int)(uVar25 ^ 0x3f) + (int)(uVar23 ^ 0x3f))) + 0x40;
  iVar40 = 0xb;
  if (iVar39 < -0x43d) {
    iVar40 = 0x40;
    if (-0x472 < iVar39) {
      iVar40 = -0x432 - iVar39;
    }
  }
  if (0x3c < iVar40) {
    bVar26 = (char)iVar40 - 0x3c;
    uVar42 = uVar42 >> (bVar26 & 0x3f);
    iVar39 = iVar39 + iVar40 + -0x3c;
    uVar37 = (uVar37 >> (bVar26 & 0x3f)) + 9;
    iVar40 = 0x3c;
  }
  bVar26 = (byte)iVar40;
  uVar35 = 0x7ff0000000000000;
  uVar23 = (~(-1L << (bVar26 & 0x3f)) & uVar42) * 8;
  lVar29 = 8L << (bVar26 - 1 & 0x3f);
  uVar25 = uVar37 + lVar29;
  uVar42 = (ulong)(uVar25 <= uVar23) + (uVar42 >> (bVar26 & 0x3f));
  if (uVar42 == 0) {
LAB_01d4a047:
    local_458 = 0;
  }
  else {
    uVar4 = 0x3f;
    if (uVar42 != 0) {
      for (; uVar42 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    iVar40 = (iVar39 + iVar40) - (int)(uVar4 ^ 0x3f);
    local_458 = 0x7ff0000000000000;
    if (iVar40 < 0x3c1) {
      local_458 = (uVar42 << ((byte)(uVar4 ^ 0x3f) & 0x3f)) >> 0xb;
      if (iVar40 < -0x43d) {
        if (iVar40 < -0x471) goto LAB_01d4a047;
        local_458 = local_458 >> (-(char)iVar40 - 0x3dU & 0x3f);
      }
      else {
        local_458 = local_458 & 0xfffffffffffff | (ulong)(iVar40 + 0x43e) << 0x34;
      }
    }
  }
  local_47c = flg;
  local_478 = (byte *)dat;
  local_470 = val;
  local_450 = err;
  if (local_458 == 0x7ff0000000000000) {
LAB_01d4a42d:
    err = local_450;
    dat = (char *)local_478;
    if ((char)local_47c < '\0') {
      if (*local_490 != (u8 *)0x0) {
        **local_490 = '\0';
      }
      local_470->tag = ((long)pbVar44 - (long)local_478) * 0x100 + 1;
      (local_470->uni).str = (char *)local_478;
      *local_490 = pbVar44;
      bVar45 = true;
      local_4a0 = pbVar44;
    }
    else {
      if ((local_47c & 0x10) != 0) {
        if (cVar2 == '-') {
          uVar35 = 0xfff0000000000000;
        }
        local_470->tag = 0x14;
        (local_470->uni).u64 = uVar35;
        goto LAB_01d49ab4;
      }
      local_488 = "number is infinity when parsed as double";
      local_4a0 = local_478;
      bVar45 = false;
    }
  }
  else {
    if ((lVar29 - uVar37 < uVar23) && (uVar23 < uVar25)) {
      uVar32 = 0xfffffbcd;
      if (0xfffffffffffff < local_458) {
        uVar32 = (uint)(local_458 >> 0x34) - 0x434;
      }
      uVar25 = (local_458 & 0xfffffffffffff) + 0x10000000000000;
      if (0xfffffffffffff >= local_458) {
        uVar25 = local_458;
      }
      local_460 = &local_440;
      local_4a0 = (byte *)dat;
      bigint_set_buf(local_460,uVar34,(i32 *)&local_464,pbVar28,pbVar38,local_498);
      local_238.used = 1;
      local_238.bits[0] = uVar25 * 2 + 1;
      if ((int)local_464 < 0) {
        iVar39 = -local_464;
        local_238.used = 1;
        iVar40 = iVar39;
        if ((int)local_464 < -0x12) {
          do {
            uVar34 = (ulong)local_238.used;
            uVar25 = 0;
            if (local_238.used != 0) {
              uVar25 = 0;
              do {
                if (local_238.bits[uVar25] != 0) goto LAB_01d4a0bb;
                uVar25 = uVar25 + 1;
              } while (local_238.used != (uint)uVar25);
              uVar25 = (ulong)local_238.used;
            }
LAB_01d4a0bb:
            if ((uint)uVar25 < local_238.used) {
              uVar25 = uVar25 & 0xffffffff;
              uVar31 = 0;
              do {
                auVar19._8_8_ = 0;
                auVar19._0_8_ = uVar31;
                auVar14._8_8_ = 0;
                auVar14._0_8_ = local_238.bits[uVar25];
                auVar19 = ZEXT816(10000000000000000000) * auVar14 + auVar19;
                uVar31 = auVar19._8_8_;
                local_238.bits[uVar25] = auVar19._0_8_;
                uVar25 = uVar25 + 1;
              } while (uVar34 != uVar25);
            }
            else {
              uVar31 = 0;
            }
            if (uVar31 != 0) {
              local_238.used = local_238.used + 1;
              local_238.bits[uVar34] = uVar31;
            }
            iVar40 = iVar39 + -0x13;
            bVar45 = 0x25 < iVar39;
            iVar39 = iVar40;
          } while (bVar45);
        }
        if (iVar40 != 0) {
          uVar34 = (ulong)local_238.used;
          uVar25 = 0;
          if (uVar34 != 0) {
            do {
              if (local_238.bits[uVar25] != 0) goto LAB_01d4a1e6;
              uVar25 = uVar25 + 1;
            } while (local_238.used != (uint)uVar25);
            uVar25 = (ulong)local_238.used;
          }
LAB_01d4a1e6:
          if ((uint)uVar25 < local_238.used) {
            uVar23 = *(ulong *)(u64_pow10_table + (long)iVar40 * 8);
            uVar25 = uVar25 & 0xffffffff;
            uVar31 = 0;
            do {
              auVar21._8_8_ = 0;
              auVar21._0_8_ = uVar31;
              auVar9._8_8_ = 0;
              auVar9._0_8_ = uVar23;
              auVar16._8_8_ = 0;
              auVar16._0_8_ = local_238.bits[uVar25];
              auVar21 = auVar9 * auVar16 + auVar21;
              uVar31 = auVar21._8_8_;
              local_238.bits[uVar25] = auVar21._0_8_;
              uVar25 = uVar25 + 1;
            } while (uVar34 != uVar25);
          }
          else {
            uVar31 = 0;
          }
          if (uVar31 != 0) {
            local_460 = &local_238;
            local_238.used = local_238.used + 1;
            goto LAB_01d4a23c;
          }
        }
      }
      else {
        uVar22 = local_464;
        uVar33 = local_464;
        if (0x12 < (int)local_464) {
          do {
            uVar34 = (ulong)local_440.used;
            uVar25 = 0;
            if (local_440.used != 0) {
              uVar25 = 0;
              do {
                if (local_440.bits[uVar25] != 0) goto LAB_01d49fe9;
                uVar25 = uVar25 + 1;
              } while (local_440.used != (uint)uVar25);
              uVar25 = (ulong)local_440.used;
            }
LAB_01d49fe9:
            if ((uint)uVar25 < local_440.used) {
              uVar25 = uVar25 & 0xffffffff;
              uVar31 = 0;
              do {
                auVar18._8_8_ = 0;
                auVar18._0_8_ = uVar31;
                auVar13._8_8_ = 0;
                auVar13._0_8_ = local_440.bits[uVar25];
                auVar18 = ZEXT816(10000000000000000000) * auVar13 + auVar18;
                uVar31 = auVar18._8_8_;
                local_440.bits[uVar25] = auVar18._0_8_;
                uVar25 = uVar25 + 1;
              } while (uVar34 != uVar25);
            }
            else {
              uVar31 = 0;
            }
            if (uVar31 != 0) {
              local_440.used = local_440.used + 1;
              local_440.bits[uVar34] = uVar31;
            }
            uVar22 = uVar33 - 0x13;
            bVar45 = 0x25 < (int)uVar33;
            uVar33 = uVar22;
          } while (bVar45);
        }
        if (uVar22 != 0) {
          uVar34 = (ulong)local_440.used;
          uVar25 = 0;
          if (uVar34 != 0) {
            do {
              if (local_440.bits[uVar25] != 0) goto LAB_01d4a164;
              uVar25 = uVar25 + 1;
            } while (local_440.used != (uint)uVar25);
            uVar25 = (ulong)local_440.used;
          }
LAB_01d4a164:
          if ((uint)uVar25 < local_440.used) {
            uVar23 = *(ulong *)(u64_pow10_table + (long)(int)uVar22 * 8);
            uVar25 = uVar25 & 0xffffffff;
            uVar31 = 0;
            do {
              auVar20._8_8_ = 0;
              auVar20._0_8_ = uVar31;
              auVar8._8_8_ = 0;
              auVar8._0_8_ = uVar23;
              auVar15._8_8_ = 0;
              auVar15._0_8_ = local_440.bits[uVar25];
              auVar20 = auVar8 * auVar15 + auVar20;
              uVar31 = auVar20._8_8_;
              local_440.bits[uVar25] = auVar20._0_8_;
              uVar25 = uVar25 + 1;
            } while (uVar34 != uVar25);
          }
          else {
            uVar31 = 0;
          }
          if (uVar31 != 0) {
            local_440.used = local_440.used + 1;
LAB_01d4a23c:
            local_460->bits[uVar34] = uVar31;
          }
        }
      }
      if ((int)uVar32 < 1) {
        uVar32 = -uVar32;
        uVar22 = uVar32 >> 6;
        uVar25 = (ulong)local_440.used;
        if ((uVar32 & 0x3f) == 0) {
          if (uVar25 != 0) {
            do {
              local_440.bits[((uVar32 >> 6) - 1) + (int)uVar25] = local_440.bits[uVar25 - 1];
              uVar25 = uVar25 - 1;
            } while (uVar25 != 0);
          }
          local_440.used = local_440.used + uVar22;
        }
        else {
          local_440.bits[uVar25] = 0;
          sVar27 = (sbyte)(uVar32 & 0x3f);
          if (uVar25 != 0) {
            do {
              local_440.bits[(uVar32 >> 6) + (int)uVar25] =
                   local_440.bits[uVar25 - 1] >> (0x40U - sVar27 & 0x3f) |
                   local_440.bits[uVar25] << sVar27;
              uVar25 = uVar25 - 1;
            } while (uVar25 != 0);
          }
          local_440.bits[uVar22] = local_440.bits[0] << sVar27;
          local_440.used =
               (local_440.used + uVar22 + 1) - (uint)(local_440.bits[local_440.used + uVar22] == 0);
        }
        if (0x3f < uVar32) {
          __s = local_440.bits;
          goto LAB_01d4a390;
        }
      }
      else {
        __s = local_238.bits;
        uVar22 = uVar32 >> 6;
        uVar25 = (ulong)local_238.used;
        if ((uVar32 & 0x3f) == 0) {
          yyjson_read_number();
        }
        else {
          local_238.bits[uVar25] = 0;
          sVar27 = (sbyte)(uVar32 & 0x3f);
          if (uVar25 != 0) {
            do {
              local_238.bits[(uVar32 >> 6) + (int)uVar25] =
                   local_238.bits[uVar25 - 1] >> (0x40U - sVar27 & 0x3f) |
                   local_238.bits[uVar25] << sVar27;
              uVar25 = uVar25 - 1;
            } while (uVar25 != 0);
          }
          local_238.bits[uVar22] = local_238.bits[0] << sVar27;
          local_238.used =
               (local_238.used + uVar22 + 1) - (uint)(local_238.bits[local_238.used + uVar22] == 0);
          if (uVar32 < 0x40) goto LAB_01d4a3a5;
        }
LAB_01d4a390:
        switchD_0105b559::default(__s,0,(ulong)(uVar22 - 1) * 8 + 8);
      }
LAB_01d4a3a5:
      uVar25 = (ulong)local_440.used;
      iVar40 = -1;
      if (local_238.used <= local_440.used) {
        iVar39 = 1;
        iVar40 = 1;
        if (local_440.used <= local_238.used) {
          do {
            if (uVar25 == 0) {
              iVar40 = 0;
              break;
            }
            uVar34 = local_440.bits[uVar25 - 1];
            uVar23 = local_238.bits[uVar25 - 1];
            iVar40 = iVar39;
            if (uVar34 >= uVar23 && uVar34 != uVar23) {
              iVar40 = 1;
            }
            if (uVar34 < uVar23) {
              iVar40 = -1;
            }
            uVar25 = uVar25 - 1;
            iVar39 = iVar40;
          } while (uVar34 == uVar23);
        }
      }
      if (iVar40 == 0) {
        uVar25 = (ulong)((uint)local_458 & 1);
      }
      else {
        uVar25 = (ulong)(0 < iVar40);
      }
      if (uVar25 + local_458 == 0x7ff0000000000000) goto LAB_01d4a42d;
      local_470->tag = 0x14;
      (local_470->uni).u64 = uVar25 + local_458 | (ulong)(cVar2 == '-') << 0x3f;
    }
    else {
      val->tag = 0x14;
      (val->uni).u64 = local_458 | (ulong)(cVar2 == '-') << 0x3f;
    }
LAB_01d49ab4:
    bVar45 = true;
    err = local_450;
    dat = (char *)local_478;
    local_4a0 = pbVar44;
  }
LAB_01d49ac5:
  if (bVar45 != false) {
    return (char *)local_4a0;
  }
LAB_01d4a9ae:
  if (err == (yyjson_read_err *)0x0) {
    return (char *)0x0;
  }
  pbVar38 = local_4a0 + -(long)dat;
  if (local_4a0 < dat || local_4a0 + -(long)dat == (byte *)0x0) {
    pbVar38 = (byte *)0x0;
  }
  err->pos = (size_t)pbVar38;
  err->msg = local_488;
  err->code = 9;
  return (char *)0x0;
}

Assistant:

const char *yyjson_read_number(const char *dat,
                               yyjson_val *val,
                               yyjson_read_flag flg,
                               const yyjson_alc *alc,
                               yyjson_read_err *err) {
#define return_err(_pos, _code, _msg) do { \
    err->pos = _pos > hdr ? (usize)(_pos - hdr) : 0; \
    err->msg = _msg; \
    err->code = YYJSON_READ_ERROR_##_code; \
    return NULL; \
} while (false)

    u8 *hdr = constcast(u8 *)dat, *cur = hdr;
    bool raw; /* read number as raw */
    u8 *raw_end; /* raw end for null-terminator */
    u8 **pre; /* previous raw end pointer */
    const char *msg;
    yyjson_read_err dummy_err;

#if !YYJSON_HAS_IEEE_754 || YYJSON_DISABLE_FAST_FP_CONV
    u8 buf[128];
    usize dat_len;
#endif

    if (!err) err = &dummy_err;
    if (unlikely(!dat)) {
        return_err(cur, INVALID_PARAMETER, "input data is NULL");
    }
    if (unlikely(!val)) {
        return_err(cur, INVALID_PARAMETER, "output value is NULL");
    }

#if !YYJSON_HAS_IEEE_754 || YYJSON_DISABLE_FAST_FP_CONV
    if (!alc) alc = &YYJSON_DEFAULT_ALC;
    dat_len = strlen(dat);
    if (dat_len < sizeof(buf)) {
        memcpy(buf, dat, dat_len + 1);
        hdr = buf;
        cur = hdr;
    } else {
        hdr = (u8 *)alc->malloc(alc->ctx, dat_len + 1);
        cur = hdr;
        if (unlikely(!hdr)) {
            return_err(cur, MEMORY_ALLOCATION, "memory allocation failed");
        }
        memcpy(hdr, dat, dat_len + 1);
    }
    hdr[dat_len] = 0;
#endif

    raw = (flg & (YYJSON_READ_NUMBER_AS_RAW | YYJSON_READ_BIGNUM_AS_RAW)) != 0;
    raw_end = NULL;
    pre = raw ? &raw_end : NULL;

#if !YYJSON_HAS_IEEE_754 || YYJSON_DISABLE_FAST_FP_CONV
    if (!read_number(&cur, pre, flg, val, &msg)) {
        if (dat_len >= sizeof(buf)) alc->free(alc->ctx, hdr);
        return_err(cur, INVALID_NUMBER, msg);
    }
    if (dat_len >= sizeof(buf)) alc->free(alc->ctx, hdr);
    if (yyjson_is_raw(val)) val->uni.str = dat;
    return dat + (cur - hdr);
#else
    if (!read_number(&cur, pre, flg, val, &msg)) {
        return_err(cur, INVALID_NUMBER, msg);
    }
    return (const char *)cur;
#endif

#undef return_err
}